

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

void qtree_onebit64(LONGLONG *a,int n,int nx,int ny,uchar *b,int bit)

{
  ulong uVar1;
  byte bVar2;
  int s00;
  int s10;
  LONGLONG b3;
  LONGLONG b2;
  LONGLONG b1;
  LONGLONG b0;
  int k;
  int j;
  int i;
  int bit_local;
  uchar *b_local;
  int ny_local;
  int nx_local;
  int n_local;
  LONGLONG *a_local;
  
  bVar2 = (byte)bit;
  uVar1 = 1L << (bVar2 & 0x3f);
  k = 0;
  for (i = 0; i < nx + -1; i = i + 2) {
    s00 = n * i;
    s10 = s00 + n;
    for (j = 0; j < ny + -1; j = j + 2) {
      b[k] = (uchar)((long)(a[s10 + 1] & uVar1 | (a[s10] & uVar1) << 1 | (a[s00 + 1] & uVar1) << 2 |
                           (a[s00] & uVar1) << 3) >> (bVar2 & 0x3f));
      k = k + 1;
      s00 = s00 + 2;
      s10 = s10 + 2;
    }
    if (j < ny) {
      b[k] = (uchar)((long)((a[s10] & uVar1) << 1 | (a[s00] & uVar1) << 3) >> (bVar2 & 0x3f));
      k = k + 1;
    }
  }
  if (i < nx) {
    s00 = n * i;
    for (j = 0; j < ny + -1; j = j + 2) {
      b[k] = (uchar)((long)((a[s00 + 1] & uVar1) << 2 | (a[s00] & uVar1) << 3) >> (bVar2 & 0x3f));
      k = k + 1;
      s00 = s00 + 2;
    }
    if (j < ny) {
      b[k] = (uchar)((long)((a[s00] & uVar1) << 3) >> (bVar2 & 0x3f));
    }
  }
  return;
}

Assistant:

static void
qtree_onebit64(LONGLONG a[], int n, int nx, int ny, unsigned char b[], int bit)
{
int i, j, k;
LONGLONG b0, b1, b2, b3;
int s10, s00;

	/*
	 * use selected bit to get amount to shift
	 */
	b0 = ((LONGLONG) 1)<<bit;
	b1 = b0<<1;
	b2 = b0<<2;
	b3 = b0<<3;
	k = 0;							/* k is index of b[i/2,j/2]	*/
	for (i = 0; i<nx-1; i += 2) {
		s00 = n*i;					/* s00 is index of a[i,j]	*/
		s10 = s00+n;				/* s10 is index of a[i+1,j]	*/
		for (j = 0; j<ny-1; j += 2) {
			b[k] = (unsigned char) (( ( a[s10+1]     & b0)
				   | ((a[s10  ]<<1) & b1)
				   | ((a[s00+1]<<2) & b2)
				   | ((a[s00  ]<<3) & b3) ) >> bit);
			k += 1;
			s00 += 2;
			s10 += 2;
		}
		if (j < ny) {
			/*
			 * row size is odd, do last element in row
			 * s00+1,s10+1 are off edge
			 */
			b[k] = (unsigned char) (( ((a[s10  ]<<1) & b1)
				   | ((a[s00  ]<<3) & b3) ) >> bit);
			k += 1;
		}
	}
	if (i < nx) {
		/*
		 * column size is odd, do last row
		 * s10,s10+1 are off edge
		 */
		s00 = n*i;
		for (j = 0; j<ny-1; j += 2) {
			b[k] = (unsigned char) (( ((a[s00+1]<<2) & b2)
				   | ((a[s00  ]<<3) & b3) ) >> bit);
			k += 1;
			s00 += 2;
		}
		if (j < ny) {
			/*
			 * both row and column size are odd, do corner element
			 * s00+1, s10, s10+1 are off edge
			 */
			b[k] = (unsigned char) (( ((a[s00  ]<<3) & b3) ) >> bit);
			k += 1;
		}
	}
}